

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionGenerator.cpp
# Opt level: O3

void __thiscall InstructionGenerator::genMathSubtract(InstructionGenerator *this,uint argCount)

{
  pointer puVar1;
  uint uVar2;
  iterator iVar3;
  vector<unsigned_int,std::allocator<unsigned_int>> *this_00;
  uint local_ac;
  undefined1 local_a8 [8];
  _Alloc_hider local_a0;
  char local_90 [16];
  bool local_80;
  uint local_7c;
  undefined1 *local_78;
  long local_70;
  undefined1 local_68 [16];
  Variable local_58;
  
  this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode;
  local_a8._0_4_ = 8;
  iVar3._M_current = *(uint **)(this_00 + 8);
  puVar1 = *(pointer *)(this_00 + 0x10);
  local_ac = argCount;
  if (iVar3._M_current == puVar1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<Instruction>
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_00,iVar3,
               (Instruction *)local_a8);
    this_00 = (vector<unsigned_int,std::allocator<unsigned_int>> *)this->bytecode;
    iVar3._M_current = *(uint **)(this_00 + 8);
    puVar1 = *(pointer *)(this_00 + 0x10);
  }
  else {
    *iVar3._M_current = 8;
    iVar3._M_current = iVar3._M_current + 1;
    *(uint **)(this_00 + 8) = iVar3._M_current;
  }
  if (iVar3._M_current == puVar1) {
    std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int&>
              (this_00,iVar3,&local_ac);
    argCount = local_ac;
  }
  else {
    *iVar3._M_current = argCount;
    *(uint **)(this_00 + 8) = iVar3._M_current + 1;
  }
  if (argCount != 0) {
    uVar2 = 0;
    do {
      VirtualStack::pop(&local_58,&this->super_VirtualStack);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58.identifier._M_dataplus._M_p != &local_58.identifier.field_2) {
        operator_delete(local_58.identifier._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < local_ac);
  }
  local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"");
  local_a8._0_4_ = INT;
  local_a0._M_p = local_90;
  std::__cxx11::string::_M_construct<char*>((string *)&local_a0,local_78,local_78 + local_70);
  local_80 = false;
  local_7c = 0;
  VirtualStack::push(&this->super_VirtualStack,(Variable *)local_a8);
  if (local_a0._M_p != local_90) {
    operator_delete(local_a0._M_p);
  }
  if (local_78 != local_68) {
    operator_delete(local_78);
  }
  return;
}

Assistant:

void InstructionGenerator::genMathSubtract(unsigned int argCount)
{
    bytecode->emplace_back(Instruction::MATH_SUBTRACT);
    bytecode->emplace_back(argCount);
    for(unsigned int a = 0; a < argCount; a++)
        pop();
    push(Variable("", DataType::INT));
}